

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PackageImportItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageImportItemSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  PackageImportItemSyntax *pPVar16;
  
  pPVar16 = (PackageImportItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PackageImportItemSyntax *)this->endPtr < pPVar16 + 1) {
    pPVar16 = (PackageImportItemSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pPVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pPVar16->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pPVar16->super_SyntaxNode).kind = PackageImportItem;
  (pPVar16->package).kind = TVar4;
  (pPVar16->package).field_0x2 = uVar5;
  (pPVar16->package).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar16->package).rawLen = uVar7;
  (pPVar16->package).info = pIVar1;
  (pPVar16->doubleColon).kind = TVar8;
  (pPVar16->doubleColon).field_0x2 = uVar9;
  (pPVar16->doubleColon).numFlags = (NumericTokenFlags)NVar10.raw;
  (pPVar16->doubleColon).rawLen = uVar11;
  (pPVar16->doubleColon).info = pIVar2;
  (pPVar16->item).kind = TVar12;
  (pPVar16->item).field_0x2 = uVar13;
  (pPVar16->item).numFlags = (NumericTokenFlags)NVar14.raw;
  (pPVar16->item).rawLen = uVar15;
  (pPVar16->item).info = pIVar3;
  return pPVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }